

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_validators.h
# Opt level: O0

bool cppcms::encoding::windows_1257_valid<char_const*>(char *p,char *e,size_t *count)

{
  byte bVar1;
  char *pcVar2;
  uint c;
  size_t *count_local;
  char *e_local;
  char *p_local;
  
  p_local = p;
  while( true ) {
    do {
      if (p_local == e) {
        return true;
      }
      *count = *count + 1;
      pcVar2 = p_local + 1;
      bVar1 = *p_local;
      p_local = pcVar2;
    } while (((bVar1 == 9) || (bVar1 == 10)) || (bVar1 == 0xd));
    if ((bVar1 < 0x20) || (bVar1 == 0x7f)) break;
    if (((((bVar1 == 0x81) || (bVar1 == 0x83)) ||
         ((bVar1 == 0x88 ||
          ((((bVar1 == 0x8a || (bVar1 == 0x8c)) || (bVar1 == 0x90)) ||
           ((bVar1 == 0x98 || (bVar1 == 0x9a)))))))) || (bVar1 == 0x9c)) ||
       (((bVar1 == 0x9f || (bVar1 == 0xa1)) || (bVar1 == 0xa5)))) {
      return false;
    }
  }
  return false;
}

Assistant:

bool windows_1257_valid(Iterator p,Iterator e,size_t &count)
	{
		while(p!=e) {
			count++;
			unsigned c=(unsigned char)*p++;
			if(c==0x09 || c==0xA || c==0xD)
				continue;
			if(c<0x20 || 0x7F==c)
				return false;
			switch(c) {
			case 0x81:
			case 0x83:
			case 0x88:
			case 0x8A:
			case 0x8C:
			case 0x90:
			case 0x98:
			case 0x9A:
			case 0x9C:
			case 0x9F:
			case 0xA1:
			case 0xA5:
				return false;
			}
		}
		return true;
	}